

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O2

ATNPath * __thiscall Centaurus::ATNPath::parent_path(ATNPath *__return_storage_ptr__,ATNPath *this)

{
  ATNPath(__return_storage_ptr__,this);
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::pop_back(&__return_storage_ptr__->
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
            );
  return __return_storage_ptr__;
}

Assistant:

ATNPath parent_path() const
    {
        ATNPath new_path(*this);

        new_path.pop();

        return new_path;
    }